

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-ieee.h
# Opt level: O3

void __thiscall
icu_63::double_conversion::Double::NormalizedBoundaries
          (Double *this,DiyFp *out_m_minus,DiyFp *out_m_plus)

{
  ulong uVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  uint64_t uVar6;
  int exponent;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  
  uVar1 = this->d64_;
  uVar8 = uVar1 & 0xfffffffffffff;
  bVar11 = (uVar1 & 0x7ff0000000000000) == 0;
  uVar9 = uVar8 + 0x10000000000000;
  if (bVar11) {
    uVar9 = uVar8;
  }
  iVar4 = -0x432;
  if (!bVar11) {
    iVar4 = ((uint)(uVar1 >> 0x34) & 0x7ff) - 0x433;
  }
  uVar5 = uVar9 * 2 + 1;
  iVar7 = iVar4 + -1;
  do {
    uVar6 = uVar5 << 10;
    iVar7 = iVar7 + -10;
    uVar10 = uVar5 >> 0x2c;
    uVar5 = uVar6;
  } while (uVar10 == 0);
  for (; -1 < (long)uVar6; uVar6 = uVar6 * 2) {
    iVar7 = iVar7 + -1;
  }
  iVar2 = iVar4 + -1;
  lVar3 = uVar9 * 2;
  if (uVar8 == 0 && (uVar1 & 0x7fe0000000000000) != 0) {
    iVar2 = iVar4 + -2;
    lVar3 = uVar9 << 2;
  }
  out_m_plus->f_ = uVar6;
  out_m_plus->e_ = iVar7;
  out_m_minus->f_ = lVar3 + -1 << ((char)iVar2 - (char)iVar7 & 0x3fU);
  out_m_minus->e_ = iVar7;
  return;
}

Assistant:

uint64_t AsUint64() const {
    return d64_;
  }